

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O3

void __thiscall QCss::Declaration::styleValues(Declaration *this,BorderStyle *s)

{
  BorderStyle BVar1;
  DeclarationData *pDVar2;
  P _a;
  ulong uVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  
  pDVar2 = (this->d).d.ptr;
  if ((pDVar2->values).d.size == 0) {
    s[0] = BorderStyle_None;
    s[1] = BorderStyle_None;
    s[2] = BorderStyle_None;
    s[3] = BorderStyle_None;
    return;
  }
  lVar4 = 0;
  uVar6 = 0;
  do {
    BVar1 = parseStyleValue((Value *)((long)&((pDVar2->values).d.ptr)->type + lVar4));
    s[uVar6] = BVar1;
    uVar6 = uVar6 + 1;
    pDVar2 = (this->d).d.ptr;
    uVar3 = (pDVar2->values).d.size;
    if (3 < uVar3) {
      uVar3 = 4;
    }
    lVar4 = lVar4 + 0x28;
  } while (uVar6 < uVar3);
  iVar5 = (int)uVar6;
  if (iVar5 == 1) {
    BVar1 = *s;
    s[1] = BVar1;
    s[2] = BVar1;
  }
  else {
    if (iVar5 == 2) {
      *(undefined8 *)(s + 2) = *(undefined8 *)s;
      return;
    }
    if (iVar5 != 3) {
      return;
    }
    BVar1 = s[1];
  }
  s[3] = BVar1;
  return;
}

Assistant:

void Declaration::styleValues(BorderStyle *s) const
{
    int i;
    for (i = 0; i < qMin(d->values.size(), 4); i++)
        s[i] = parseStyleValue(d->values.at(i));
    if (i == 0) s[0] = s[1] = s[2] = s[3] = BorderStyle_None;
    else if (i == 1) s[3] = s[2] = s[1] = s[0];
    else if (i == 2) s[2] = s[0], s[3] = s[1];
    else if (i == 3) s[3] = s[1];
}